

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemoNoTemplates.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *this;
  
  demo1();
  demo2();
  demo3();
  this = std::operator<<((ostream *)&std::cout,"\n\t --- IMLE demo (no templates) ended! ---");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    demo1();
    demo2();
    demo3();

    cout << "\n\t --- IMLE demo (no templates) ended! ---" << endl;
    return 0;
}